

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsc_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
do_deliver_message(limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>
                   *this,type_index *msg_type,message_ref_t *message,uint overlimit_reaction_deep)

{
  anon_class_32_4_1988f3e1 l;
  deliver_op_tracer local_25;
  uint local_24;
  deliver_op_tracer tracer;
  message_ref_t *pmStack_20;
  uint overlimit_reaction_deep_local;
  message_ref_t *message_local;
  type_index *msg_type_local;
  limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  local_24 = overlimit_reaction_deep;
  pmStack_20 = message;
  msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer::deliver_op_tracer
            (&local_25,(tracing_disabled_base *)this,&this->super_abstract_message_box_t,
             "deliver_message",msg_type,message,overlimit_reaction_deep);
  l.this = this;
  l.tracer = &local_25;
  l.msg_type = msg_type;
  l.message = pmStack_20;
  do_delivery<so_5::impl::limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::do_deliver_message(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,unsigned_int)const::_lambda()_1_>
            (this,&local_25,l);
  return;
}

Assistant:

virtual void
		do_deliver_message(
			const std::type_index & msg_type,
			const message_ref_t & message,
			unsigned int overlimit_reaction_deep ) const override
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as TRACING_BASE
						*this, // as abstract_message_box_t
						"deliver_message",
						msg_type, message, overlimit_reaction_deep };

				this->do_delivery( tracer, [&] {
					tracer.push_to_queue( m_single_consumer );

					agent_t::call_push_event(
							*m_single_consumer,
							message_limit::control_block_t::none(),
							m_id,
							msg_type,
							message );
				} );
			}